

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O0

bool __thiscall
QSystemSemaphorePosix::modifySemaphore
          (QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self,int count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int in_EDX;
  QSystemSemaphorePosix *in_RSI;
  undefined8 *in_RDI;
  QSystemSemaphorePrivate *in_stack_00000008;
  AccessMode in_stack_0000001c;
  QSystemSemaphorePrivate *in_stack_00000020;
  QSystemSemaphorePosix *in_stack_00000028;
  int res_1;
  int res;
  int cnt;
  undefined1 in_stack_00000170 [16];
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffa7;
  char *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffd0 [16];
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = handle(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  if (bVar1) {
    iVar3 = in_EDX;
    if (in_EDX < 1) {
      do {
        iVar3 = sem_wait((sem_t *)*in_RDI);
        uVar5 = false;
        if (iVar3 == -1) {
          piVar4 = __errno_location();
          uVar5 = *piVar4 == 4;
        }
        iVar2 = in_stack_ffffffffffffffd0._12_4_;
      } while ((bool)uVar5 != false);
      if (iVar3 == -1) {
        piVar4 = __errno_location();
        if ((*piVar4 != 0x16) && (piVar4 = __errno_location(), *piVar4 != 0x2b)) {
          Qt::Literals::StringLiterals::operator____L1
                    (in_stack_ffffffffffffffa8,
                     CONCAT17(in_stack_ffffffffffffffa7,CONCAT16(uVar5,in_stack_ffffffffffffffa0)));
          QSystemSemaphorePrivate::setUnixErrorString
                    (in_stack_00000008,(QLatin1StringView)in_stack_00000170);
          return false;
        }
        *in_RDI = 0;
        bVar1 = modifySemaphore(in_RSI,(QSystemSemaphorePrivate *)
                                       CONCAT44(in_EDX,in_stack_ffffffffffffffe0),iVar2);
        return bVar1;
      }
      in_stack_ffffffffffffffa6 = 0;
    }
    else {
      do {
        iVar2 = sem_post((sem_t *)*in_RDI);
        if (iVar2 == -1) {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_RSI,
                     CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
          QSystemSemaphorePrivate::setUnixErrorString
                    (in_stack_00000008,(QLatin1StringView)in_stack_00000170);
          for (; in_EDX < iVar3; in_EDX = in_EDX + 1) {
            do {
              iVar2 = sem_wait((sem_t *)*in_RDI);
              bVar1 = false;
              if (iVar2 == -1) {
                piVar4 = __errno_location();
                bVar1 = *piVar4 == 4;
              }
            } while (bVar1);
          }
          return false;
        }
        in_EDX = in_EDX + -1;
      } while (0 < in_EDX);
    }
    QSystemSemaphorePrivate::clearError
              ((QSystemSemaphorePrivate *)
               CONCAT17(in_stack_ffffffffffffffa7,
                        CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QSystemSemaphorePosix::modifySemaphore(QSystemSemaphorePrivate *self, int count)
{
    if (!handle(self, QSystemSemaphore::Open))
        return false;

    if (count > 0) {
        int cnt = count;
        do {
            if (::sem_post(semaphore) == -1) {
#if defined(Q_OS_VXWORKS)
                if (errno == EINVAL) {
                    semaphore = SEM_FAILED;
                    return modifySemaphore(self, cnt);
                }
#endif
                self->setUnixErrorString("QSystemSemaphore::modifySemaphore (sem_post)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
                qDebug("QSystemSemaphorePosix::modify sem_post failed %d %d", count, errno);
#endif
                // rollback changes to preserve the SysV semaphore behavior
                for ( ; cnt < count; ++cnt) {
                    int res;
                    QT_EINTR_LOOP(res, ::sem_wait(semaphore));
                }
                return false;
            }
            --cnt;
        } while (cnt > 0);
    } else {
        int res;
        QT_EINTR_LOOP(res, ::sem_wait(semaphore));
        if (res == -1) {
            // If the semaphore was removed be nice and create it and then modifySemaphore again
            if (errno == EINVAL || errno == EIDRM) {
                semaphore = SEM_FAILED;
                return modifySemaphore(self, count);
            }
            self->setUnixErrorString("QSystemSemaphore::modifySemaphore (sem_wait)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphorePosix::modify sem_wait failed %d %d", count, errno);
#endif
            return false;
        }
    }

    self->clearError();
    return true;
}